

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O3

void printPostIdxImm8Operand(MCInst *MI,uint OpNum,SStream *O)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  char *pcVar3;
  MCOperand *op;
  ulong uVar4;
  char *pcVar5;
  uint uVar6;
  undefined4 in_register_00000034;
  
  op = MCInst_getOperand(MI,3);
  uVar4 = MCOperand_getImm(op);
  pcVar5 = anon_var_dwarf_e9e71 + 0x11;
  if (((uint)uVar4 >> 8 & 1) == 0) {
    pcVar5 = "-";
  }
  uVar6 = (uint)(uVar4 & 0xff);
  pcVar3 = ", #%s%u";
  if (9 < uVar6) {
    pcVar3 = ", #%s0x%x";
  }
  SStream_concat((SStream *)CONCAT44(in_register_00000034,OpNum),pcVar3 + 2,pcVar5,uVar4 & 0xff);
  if (MI->csh->detail != CS_OPT_OFF) {
    pcVar2 = MI->flat_insn->detail;
    puVar1 = pcVar2->groups + (ulong)(pcVar2->field_6).arm.op_count * 0x28 + 0x42;
    puVar1[0] = '\x02';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    pcVar2 = MI->flat_insn->detail;
    *(uint *)(pcVar2->groups + (ulong)(pcVar2->field_6).arm.op_count * 0x28 + 0x46) = uVar6;
    puVar1 = &(MI->flat_insn->detail->field_6).arm.op_count;
    *puVar1 = *puVar1 + '\x01';
  }
  return;
}

Assistant:

static void printPostIdxImm8Operand(MCInst *MI, unsigned OpNum, SStream *O)
{
	MCOperand *MO = MCInst_getOperand(MI, OpNum);
	unsigned Imm = (unsigned int)MCOperand_getImm(MO);
	if ((Imm & 0xff) > HEX_THRESHOLD)
		SStream_concat(O, "#%s0x%x", ((Imm & 256) ? "" : "-"), (Imm & 0xff));
	else
		SStream_concat(O, "#%s%u", ((Imm & 256) ? "" : "-"), (Imm & 0xff));
	if (MI->csh->detail) {
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_IMM;
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].imm = Imm & 0xff;
		MI->flat_insn->detail->arm.op_count++;
	}
}